

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::anon_unknown_37::IsGlobPattern(string *pattern)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  string *pattern_local;
  
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  bVar3 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,testing::internal::(anonymous_namespace)::IsGlobPattern(std::__cxx11::string_const&)::__0>
                    (uVar1,uVar2);
  return bVar3;
}

Assistant:

bool IsGlobPattern(const std::string& pattern) {
  return std::any_of(pattern.begin(), pattern.end(),
                     [](const char c) { return c == '?' || c == '*'; });
}